

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetWindowDock(ImGuiWindow *window,ImGuiID dock_id,ImGuiCond cond)

{
  ImGuiID IVar1;
  void *pvVar2;
  void *pvVar3;
  ImGuiID *pIVar4;
  
  if ((cond == 0) || (((char)window->field_0xf3 & cond) != 0)) {
    window->field_0xf3 = window->field_0xf3 & 0xf1;
    IVar1 = window->DockId;
    if (IVar1 != dock_id) {
      pvVar2 = ImGuiStorage::GetVoidPtr(&(GImGui->DockContext).Nodes,dock_id);
      if ((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 0x20) != 0)) {
        do {
          pvVar3 = pvVar2;
          pvVar2 = *(void **)((long)pvVar3 + 0x18);
        } while (*(void **)((long)pvVar3 + 0x18) != (void *)0x0);
        pIVar4 = *(ImGuiID **)((long)pvVar3 + 0x98);
        if (pIVar4 == (ImGuiID *)0x0) {
          pIVar4 = (ImGuiID *)((long)pvVar3 + 0xb8);
        }
        else if ((*(byte *)((long)pIVar4 + 0x11) & 8) == 0) {
          __assert_fail("new_node->CentralNode->IsCentralNode()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                        ,0x3f82,"void ImGui::SetWindowDock(ImGuiWindow *, ImGuiID, ImGuiCond)");
        }
        dock_id = *pIVar4;
      }
      if (IVar1 != dock_id) {
        if (window->DockNode != (ImGuiDockNode *)0x0) {
          DockNodeRemoveWindow(window->DockNode,window,0);
        }
        window->DockId = dock_id;
      }
    }
  }
  return;
}

Assistant:

void ImGui::SetWindowDock(ImGuiWindow* window, ImGuiID dock_id, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowDockAllowFlags & cond) == 0)
        return;
    window->SetWindowDockAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    if (window->DockId == dock_id)
        return;

    // If the user attempt to set a dock id that is a split node, we'll dig within to find a suitable docking spot
    ImGuiContext* ctx = GImGui;
    if (ImGuiDockNode* new_node = DockContextFindNodeByID(ctx, dock_id))
        if (new_node->IsSplitNode())
        {
            // Policy: Find central node or latest focused node. We first move back to our root node.
            new_node = DockNodeGetRootNode(new_node);
            if (new_node->CentralNode)
            {
                IM_ASSERT(new_node->CentralNode->IsCentralNode());
                dock_id = new_node->CentralNode->ID;
            }
            else
            {
                dock_id = new_node->LastFocusedNodeId;
            }
        }

    if (window->DockId == dock_id)
        return;

    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, 0);
    window->DockId = dock_id;
}